

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O1

mmt_buf * find_ptr(uint64_t ptr,mmt_memory_dump *args,int argc)

{
  long lVar1;
  
  if (argc < 1 || ptr == 0) {
    return (mmt_buf *)0x0;
  }
  lVar1 = 0;
  do {
    if (*(uint64_t *)((long)&args->addr + lVar1) == ptr) {
      return *(mmt_buf **)((long)&args->data + lVar1);
    }
    lVar1 = lVar1 + 0x18;
  } while ((ulong)(uint)argc * 0x18 != lVar1);
  return (mmt_buf *)0x0;
}

Assistant:

struct mmt_buf *find_ptr(uint64_t ptr, struct mmt_memory_dump *args, int argc)
{
	int i;
	if (!ptr)
		return NULL;
	for (i = 0; i < argc; ++i)
		if (args[i].addr == ptr)
			return args[i].data;

	return NULL;
}